

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O1

bool __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::SetPipelineState
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,IPipelineState *pPipelineState,
          INTERFACE_ID *IID_PSOImpl)

{
  RefCntAutoPtr<Diligent::PipelineStateVkImpl> *this_00;
  DeviceContextCommandCounters *pDVar1;
  COMMAND_QUEUE_TYPE CVar2;
  ulong uVar3;
  _Alloc_hider _Var4;
  DeviceContextIndex DVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  INTERFACE_ID *extraout_RDX;
  INTERFACE_ID *extraout_RDX_00;
  INTERFACE_ID *pIVar8;
  char *in_R8;
  char (*in_R9) [8];
  PipelineStateVkImpl *pObj;
  string msg;
  RefCntAutoPtr<Diligent::PipelineStateVkImpl> pPipelineStateImpl;
  char (*in_stack_ffffffffffffff88) [3];
  string local_70;
  String local_50;
  
  if (pPipelineState == (IPipelineState *)0x0) {
    FormatString<char[32]>(&local_70,(char (*) [32])"Pipeline state must not be null");
    DebugAssertionFailed
              (local_70._M_dataplus._M_p,"SetPipelineState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x308);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    bVar6 = false;
  }
  else {
    pIVar8 = IID_PSOImpl;
    if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
      if ((this->m_Desc).IsDeferred == false) {
        FormatString<char[79]>
                  (&local_70,
                   (char (*) [79])
                   "Queue type may never be unknown for immediate contexts. This looks like a bug.")
        ;
        DebugAssertionFailed
                  (local_70._M_dataplus._M_p,"SetPipelineState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x30c);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      FormatString<char[97]>
                (&local_70,
                 (char (*) [97])
                 "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
                );
      DebugAssertionFailed
                (local_70._M_dataplus._M_p,"SetPipelineState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x30c);
      pIVar8 = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        pIVar8 = extraout_RDX_00;
      }
    }
    CVar2 = (this->m_Desc).QueueType;
    if ((~CVar2 & 3) != 0) {
      GetCommandQueueTypeString_abi_cxx11_
                (&local_50,(Diligent *)(ulong)CVar2,(COMMAND_QUEUE_TYPE)pIVar8);
      in_R8 = " queue.";
      FormatString<char[17],char[22],std::__cxx11::string,char[8]>
                (&local_70,(Diligent *)"SetPipelineState",(char (*) [17])0x917e3a,
                 (char (*) [22])&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",
                 in_R9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      DebugAssertionFailed
                (local_70._M_dataplus._M_p,"SetPipelineState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x30c);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    iVar7 = (*(pPipelineState->super_IDeviceObject).super_IObject._vptr_IObject[4])(pPipelineState);
    uVar3 = *(ulong *)(CONCAT44(extraout_var,iVar7) + 0x10);
    DVar5 = GetExecutionCtxId(this);
    if ((uVar3 >> ((ulong)DVar5.m_Value & 0x3f) & 1) == 0) {
      in_R8 = (char *)&this->m_Desc;
      iVar7 = (*(pPipelineState->super_IDeviceObject).super_IObject._vptr_IObject[4])
                        (pPipelineState);
      FormatString<char[6],char_const*,char[36],char_const*,char[3]>
                (&local_70,(Diligent *)0x82578b,(char (*) [6])CONCAT44(extraout_var_00,iVar7),
                 (char **)"\' can\'t be used in device context \'",(char (*) [36])in_R8,
                 (char **)"\'.",in_stack_ffffffffffffff88);
      DebugAssertionFailed
                (local_70._M_dataplus._M_p,"SetPipelineState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x30f);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    iVar7 = (*(pPipelineState->super_IDeviceObject).super_IObject._vptr_IObject[0x15])
                      (pPipelineState,0);
    if (iVar7 != 2) {
      iVar7 = (*(pPipelineState->super_IDeviceObject).super_IObject._vptr_IObject[4])
                        (pPipelineState);
      FormatString<char[6],char_const*,char[62]>
                (&local_70,(Diligent *)0x82578b,(char (*) [6])CONCAT44(extraout_var_01,iVar7),
                 (char **)"\' is not ready. Use GetStatus() to check the pipeline status.",
                 (char (*) [62])in_R8);
      DebugAssertionFailed
                (local_70._M_dataplus._M_p,"SetPipelineState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x313);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    local_50._M_dataplus._M_p = (pointer)0x0;
    (**(pPipelineState->super_IDeviceObject).super_IObject._vptr_IObject)
              (pPipelineState,IID_PSOImpl);
    if ((PipelineStateVkImpl *)local_50._M_dataplus._M_p == (PipelineStateVkImpl *)0x0) {
      FormatString<char[45]>
                (&local_70,(char (*) [45])"Unknown pipeline state object implementation");
      DebugAssertionFailed
                (local_70._M_dataplus._M_p,"SetPipelineState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x318);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    bVar6 = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
            ::IsSameObject((DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                            *)(this->m_pPipelineState).m_pObject,
                           (DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                            *)local_50._M_dataplus._M_p);
    _Var4._M_p = local_50._M_dataplus._M_p;
    if (!bVar6) {
      this_00 = &this->m_pPipelineState;
      if (this_00->m_pObject != (PipelineStateVkImpl *)local_50._M_dataplus._M_p) {
        local_50._M_dataplus._M_p = (pointer)0x0;
        RefCntAutoPtr<Diligent::PipelineStateVkImpl>::Release(this_00);
        this_00->m_pObject = (PipelineStateVkImpl *)_Var4._M_p;
      }
      pDVar1 = &(this->m_Stats).CommandCounters;
      pDVar1->SetPipelineState = pDVar1->SetPipelineState + 1;
    }
    bVar6 = !bVar6;
    RefCntAutoPtr<Diligent::PipelineStateVkImpl>::Release
              ((RefCntAutoPtr<Diligent::PipelineStateVkImpl> *)&local_50);
  }
  return bVar6;
}

Assistant:

inline bool DeviceContextBase<ImplementationTraits>::SetPipelineState(
    IPipelineState*     pPipelineState,
    const INTERFACE_ID& IID_PSOImpl)
{
    if (pPipelineState == nullptr)
    {
        DEV_ERROR("Pipeline state must not be null");
        return false;
    }

    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_COMPUTE, "SetPipelineState");

    DEV_CHECK_ERR((pPipelineState->GetDesc().ImmediateContextMask & (Uint64{1} << GetExecutionCtxId())) != 0,
                  "PSO '", pPipelineState->GetDesc().Name, "' can't be used in device context '", m_Desc.Name, "'.");

    // Check that the PSO is ready before querying the implementation.
    DEV_CHECK_ERR(pPipelineState->GetStatus() == PIPELINE_STATE_STATUS_READY, "PSO '", pPipelineState->GetDesc().Name,
                  "' is not ready. Use GetStatus() to check the pipeline status.");

    // Note that pPipelineStateImpl may not be the same as pPipelineState (for example, if pPipelineState
    // is a reloadable pipeline).
    RefCntAutoPtr<PipelineStateImplType> pPipelineStateImpl{pPipelineState, IID_PSOImpl};
    VERIFY(pPipelineStateImpl != nullptr, "Unknown pipeline state object implementation");
    if (PipelineStateImplType::IsSameObject(m_pPipelineState, pPipelineStateImpl))
        return false;

    m_pPipelineState = std::move(pPipelineStateImpl);
    ++m_Stats.CommandCounters.SetPipelineState;

    return true;
}